

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_Read_single(UA_Server *server,UA_Session *session,UA_TimestampsToReturn timestamps,
                        UA_ReadValueId *id,UA_DataValue *v)

{
  UA_Boolean UVar1;
  UA_VariableNode *vn;
  UA_DateTime UVar2;
  uint local_80;
  uint local_78;
  uint local_74;
  UA_StatusCode local_64;
  UA_StatusCode retval;
  UA_Node *node;
  UA_DataValue *v_local;
  UA_ReadValueId *id_local;
  UA_TimestampsToReturn timestamps_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_78 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_74 = 0;
    }
    else {
      local_74 = session->channel->connection->sockfd;
    }
    local_78 = local_74;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_80 = 0;
  }
  else {
    local_80 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Read the attribute %i"
               ,(ulong)local_78,(ulong)local_80,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7],id->attributeId);
  if (((id->dataEncoding).name.length == 0) ||
     (UVar1 = UA_String_equal(&binEncoding,&(id->dataEncoding).name), UVar1)) {
    if (((id->indexRange).length == 0) || (id->attributeId == 0xd)) {
      vn = (UA_VariableNode *)UA_NodeStore_get(server->nodestore,&id->nodeId);
      if (vn == (UA_VariableNode *)0x0) {
        *(byte *)v = *(byte *)v & 0xfd | 2;
        v->status = 0x80340000;
      }
      else {
        local_64 = 0;
        switch(id->attributeId) {
        case 1:
          forceVariantSetScalar(&v->value,vn,UA_TYPES + 0x10);
          break;
        case 2:
          forceVariantSetScalar(&v->value,&vn->nodeClass,UA_TYPES + 0x40);
          break;
        case 3:
          forceVariantSetScalar(&v->value,&vn->browseName,UA_TYPES + 0x13);
          break;
        case 4:
          forceVariantSetScalar(&v->value,&vn->displayName,UA_TYPES + 0x14);
          break;
        case 5:
          forceVariantSetScalar(&v->value,&vn->description,UA_TYPES + 0x14);
          break;
        case 6:
          forceVariantSetScalar(&v->value,&vn->writeMask,UA_TYPES + 6);
          break;
        case 7:
          forceVariantSetScalar(&v->value,&vn->userWriteMask,UA_TYPES + 6);
          break;
        case 8:
          local_64 = readIsAbstractAttribute((UA_Node *)vn,&v->value);
          break;
        case 9:
          if ((vn->nodeClass & UA_NODECLASS_REFERENCETYPE) == UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar
                      (&v->value,(void *)((long)&(vn->dataType).namespaceIndex + 1),UA_TYPES);
          }
          break;
        case 10:
          if ((vn->nodeClass & UA_NODECLASS_REFERENCETYPE) == UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar(&v->value,&(vn->dataType).identifier,UA_TYPES + 0x14);
          }
          break;
        case 0xb:
          if ((vn->nodeClass & UA_NODECLASS_VIEW) == UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar
                      (&v->value,(void *)((long)&(vn->dataType).namespaceIndex + 1),UA_TYPES);
          }
          break;
        case 0xc:
          if ((vn->nodeClass & (UA_NODECLASS_VIEW|UA_NODECLASS_OBJECT)) == UA_NODECLASS_UNSPECIFIED)
          {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar(&v->value,&vn->dataType,UA_TYPES + 2);
          }
          break;
        case 0xd:
          if ((vn->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
              UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            local_64 = readValueAttributeComplete(server,vn,timestamps,&id->indexRange,v);
          }
          break;
        case 0xe:
          if ((vn->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
              UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar(&v->value,&vn->dataType,UA_TYPES + 0x10);
          }
          break;
        case 0xf:
          if ((vn->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
              UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar(&v->value,&vn->valueRank,UA_TYPES + 5);
          }
          break;
        case 0x10:
          if ((vn->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
              UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            local_64 = readArrayDimensionsAttribute(vn,v);
          }
          break;
        case 0x11:
          if ((vn->nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar(&v->value,&vn->accessLevel,UA_TYPES + 2);
          }
          break;
        case 0x12:
          if ((vn->nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar(&v->value,&vn->userAccessLevel,UA_TYPES + 2);
          }
          break;
        case 0x13:
          if ((vn->nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar(&v->value,&vn->minimumSamplingInterval,UA_TYPES + 10);
          }
          break;
        case 0x14:
          if ((vn->nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar(&v->value,&vn->historizing,UA_TYPES);
          }
          break;
        case 0x15:
          if ((vn->nodeClass & UA_NODECLASS_METHOD) == UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar(&v->value,&vn->dataType,UA_TYPES);
          }
          break;
        case 0x16:
          if ((vn->nodeClass & UA_NODECLASS_METHOD) == UA_NODECLASS_UNSPECIFIED) {
            local_64 = 0x80350000;
          }
          else {
            forceVariantSetScalar
                      (&v->value,(void *)((long)&(vn->dataType).namespaceIndex + 1),UA_TYPES);
          }
          break;
        default:
          local_64 = 0x80350000;
        }
        if (local_64 == 0) {
          *(byte *)v = *(byte *)v & 0xfe | 1;
          if ((timestamps == UA_TIMESTAMPSTORETURN_SERVER) ||
             (timestamps == UA_TIMESTAMPSTORETURN_BOTH)) {
            UVar2 = UA_DateTime_now();
            v->serverTimestamp = UVar2;
            *(byte *)v = *(byte *)v & 0xf7 | 8;
          }
          if (id->attributeId == 0xd) {
            if ((timestamps == UA_TIMESTAMPSTORETURN_SERVER) ||
               (timestamps == UA_TIMESTAMPSTORETURN_NEITHER)) {
              *(byte *)v = *(byte *)v & 0xfb;
              *(byte *)v = *(byte *)v & 0xef;
            }
            else if ((*(byte *)v >> 2 & 1) == 0) {
              UVar2 = UA_DateTime_now();
              v->sourceTimestamp = UVar2;
              *(byte *)v = *(byte *)v & 0xfb | 4;
            }
          }
        }
        else {
          *(byte *)v = *(byte *)v & 0xfd | 2;
          v->status = local_64;
        }
      }
    }
    else {
      *(byte *)v = *(byte *)v & 0xfd | 2;
      v->status = 0x80370000;
    }
  }
  else {
    *(byte *)v = *(byte *)v & 0xfd | 2;
    v->status = 0x80390000;
  }
  return;
}

Assistant:

void Service_Read_single(UA_Server *server, UA_Session *session,
                         const UA_TimestampsToReturn timestamps,
                         const UA_ReadValueId *id, UA_DataValue *v) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Read the attribute %i", id->attributeId);

    /* XML encoding is not supported */
    if(id->dataEncoding.name.length > 0 &&
       !UA_String_equal(&binEncoding, &id->dataEncoding.name)) {
           v->hasStatus = true;
           v->status = UA_STATUSCODE_BADDATAENCODINGUNSUPPORTED;
           return;
    }

    /* Index range for an attribute other than value */
    if(id->indexRange.length > 0 && id->attributeId != UA_ATTRIBUTEID_VALUE) {
        v->hasStatus = true;
        v->status = UA_STATUSCODE_BADINDEXRANGENODATA;
        return;
    }

    /* Get the node */
    const UA_Node *node = UA_NodeStore_get(server->nodestore, &id->nodeId);
    if(!node) {
        v->hasStatus = true;
        v->status = UA_STATUSCODE_BADNODEIDUNKNOWN;
        return;
    }

    /* Read the attribute */
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(id->attributeId) {
    case UA_ATTRIBUTEID_NODEID:
        forceVariantSetScalar(&v->value, &node->nodeId, &UA_TYPES[UA_TYPES_NODEID]);
        break;
    case UA_ATTRIBUTEID_NODECLASS:
        forceVariantSetScalar(&v->value, &node->nodeClass, &UA_TYPES[UA_TYPES_NODECLASS]);
        break;
    case UA_ATTRIBUTEID_BROWSENAME:
        forceVariantSetScalar(&v->value, &node->browseName, &UA_TYPES[UA_TYPES_QUALIFIEDNAME]);
        break;
    case UA_ATTRIBUTEID_DISPLAYNAME:
        forceVariantSetScalar(&v->value, &node->displayName, &UA_TYPES[UA_TYPES_LOCALIZEDTEXT]);
        break;
    case UA_ATTRIBUTEID_DESCRIPTION:
        forceVariantSetScalar(&v->value, &node->description, &UA_TYPES[UA_TYPES_LOCALIZEDTEXT]);
        break;
    case UA_ATTRIBUTEID_WRITEMASK:
        forceVariantSetScalar(&v->value, &node->writeMask, &UA_TYPES[UA_TYPES_UINT32]);
        break;
    case UA_ATTRIBUTEID_USERWRITEMASK:
        forceVariantSetScalar(&v->value, &node->userWriteMask, &UA_TYPES[UA_TYPES_UINT32]);
        break;
    case UA_ATTRIBUTEID_ISABSTRACT:
        retval = readIsAbstractAttribute(node, &v->value);
        break;
    case UA_ATTRIBUTEID_SYMMETRIC:
        CHECK_NODECLASS(UA_NODECLASS_REFERENCETYPE);
        forceVariantSetScalar(&v->value, &((const UA_ReferenceTypeNode*)node)->symmetric,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_INVERSENAME:
        CHECK_NODECLASS(UA_NODECLASS_REFERENCETYPE);
        forceVariantSetScalar(&v->value, &((const UA_ReferenceTypeNode*)node)->inverseName,
                              &UA_TYPES[UA_TYPES_LOCALIZEDTEXT]);
        break;
    case UA_ATTRIBUTEID_CONTAINSNOLOOPS:
        CHECK_NODECLASS(UA_NODECLASS_VIEW);
        forceVariantSetScalar(&v->value, &((const UA_ViewNode*)node)->containsNoLoops,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_EVENTNOTIFIER:
        CHECK_NODECLASS(UA_NODECLASS_VIEW | UA_NODECLASS_OBJECT);
        forceVariantSetScalar(&v->value, &((const UA_ViewNode*)node)->eventNotifier,
                              &UA_TYPES[UA_TYPES_BYTE]);
        break;
    case UA_ATTRIBUTEID_VALUE:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        retval = readValueAttributeComplete(server, (const UA_VariableNode*)node,
                                            timestamps, &id->indexRange, v);
        break;
    case UA_ATTRIBUTEID_DATATYPE:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        forceVariantSetScalar(&v->value, &((const UA_VariableTypeNode*)node)->dataType,
                              &UA_TYPES[UA_TYPES_NODEID]);
        break;
    case UA_ATTRIBUTEID_VALUERANK:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        forceVariantSetScalar(&v->value, &((const UA_VariableTypeNode*)node)->valueRank,
                              &UA_TYPES[UA_TYPES_INT32]);
        break;
    case UA_ATTRIBUTEID_ARRAYDIMENSIONS:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        retval = readArrayDimensionsAttribute((const UA_VariableNode*)node, v);
        break;
    case UA_ATTRIBUTEID_ACCESSLEVEL:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->accessLevel,
                              &UA_TYPES[UA_TYPES_BYTE]);
        break;
    case UA_ATTRIBUTEID_USERACCESSLEVEL:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->userAccessLevel,
                              &UA_TYPES[UA_TYPES_BYTE]);
        break;
    case UA_ATTRIBUTEID_MINIMUMSAMPLINGINTERVAL:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->minimumSamplingInterval,
                              &UA_TYPES[UA_TYPES_DOUBLE]);
        break;
    case UA_ATTRIBUTEID_HISTORIZING:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->historizing,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_EXECUTABLE:
        CHECK_NODECLASS(UA_NODECLASS_METHOD);
        forceVariantSetScalar(&v->value, &((const UA_MethodNode*)node)->executable,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_USEREXECUTABLE:
        CHECK_NODECLASS(UA_NODECLASS_METHOD);
        forceVariantSetScalar(&v->value, &((const UA_MethodNode*)node)->userExecutable,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    default:
        retval = UA_STATUSCODE_BADATTRIBUTEIDINVALID;
    }

    /* Return error code when reading has failed */
    if(retval != UA_STATUSCODE_GOOD) {
        v->hasStatus = true;
        v->status = retval;
        return;
    }

    v->hasValue = true;

    /* Create server timestamp */
    if(timestamps == UA_TIMESTAMPSTORETURN_SERVER ||
       timestamps == UA_TIMESTAMPSTORETURN_BOTH) {
        v->serverTimestamp = UA_DateTime_now();
        v->hasServerTimestamp = true;
    }

    /* Handle source time stamp */
    if(id->attributeId == UA_ATTRIBUTEID_VALUE) {
        if (timestamps == UA_TIMESTAMPSTORETURN_SERVER ||
            timestamps == UA_TIMESTAMPSTORETURN_NEITHER) {
            v->hasSourceTimestamp = false;
            v->hasSourcePicoseconds = false;
        } else if(!v->hasSourceTimestamp) {
            v->sourceTimestamp = UA_DateTime_now();
            v->hasSourceTimestamp = true;
        }
    }
}